

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitStore
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Store *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_00 [8];
  Address memorySize;
  Literal *pLVar2;
  Address addr;
  undefined1 local_100 [8];
  Flow ptr;
  Flow value;
  Literal local_58;
  undefined1 local_40 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_100,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptr.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
    if (value.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_40,this,(Name)(curr->memory).super_IString.str);
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,memory);
      this_00 = local_40;
      pLVar2 = Flow::getSingleValue((Flow *)local_100);
      ::wasm::Literal::Literal((Literal *)&value.breakTo.super_IString.str._M_str,pLVar2);
      addr = getFinalAddress<wasm::Store>
                       ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                        (Literal *)&value.breakTo.super_IString.str._M_str,memorySize);
      ::wasm::Literal::~Literal((Literal *)&value.breakTo.super_IString.str._M_str);
      if (curr->isAtomic == true) {
        checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,addr,(uint)curr->bytes,
                           memorySize);
      }
      pEVar1 = *(ExternalInterface **)((long)local_40 + 0x288);
      pLVar2 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
      ::wasm::Literal::Literal(&local_58,pLVar2);
      (*pEVar1->_vptr_ExternalInterface[0xc])
                (pEVar1,curr,addr.addr,&local_58,info.instance,info.name.super_IString.str._M_len);
      ::wasm::Literal::~Literal(&local_58);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_100);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStore(Store* curr) {
    NOTE_ENTER("Store");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    if (curr->isAtomic) {
      info.instance->checkAtomicAddress(addr, curr->bytes, memorySize);
    }
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    info.instance->externalInterface->store(
      curr, addr, value.getSingleValue(), info.name);
    return Flow();
  }